

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

unsigned_long
cfgfile::format_t<unsigned_long,_cfgfile::string_trait_t>::from_string
          (parser_info_t<cfgfile::string_trait_t> *info,string_t *value)

{
  unsigned_long uVar1;
  exception_t<cfgfile::string_trait_t> *this;
  allocator<char> local_23c;
  allocator<char> local_23b;
  allocator<char> local_23a;
  allocator<char> local_239;
  size_t pos;
  string local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  string local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pos = 0;
  uVar1 = std::__cxx11::stoul(value,&pos,10);
  if (pos == value->_M_string_length) {
    return uVar1;
  }
  this = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"Invalid value: \"",&local_23a);
  std::__cxx11::string::string((string *)&local_130,local_150);
  std::operator+(&local_110,&local_130,value);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"\". In file \"",&local_23b);
  std::__cxx11::string::string((string *)&local_170,local_190);
  std::operator+(&local_f0,&local_110,&local_170);
  std::operator+(&local_d0,&local_f0,&info->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"\" on line ",&local_23c);
  std::__cxx11::string::string((string *)&local_1b0,local_1d0);
  std::operator+(&local_b0,&local_d0,&local_1b0);
  std::__cxx11::to_string(&local_1f0,info->m_line_number);
  std::operator+(local_90,&local_b0,&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>(local_230,".",&local_239);
  std::__cxx11::string::string((string *)&local_210,local_230);
  std::operator+(&local_50,local_90,&local_210);
  exception_t<cfgfile::string_trait_t>::exception_t(this,&local_50);
  __cxa_throw(this,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

static unsigned long from_string( const parser_info_t< string_trait_t > & info,
		const string_trait_t::string_t & value )
	{
		try {
			std::size_t pos = 0;

			unsigned long result = std::stoul( value, &pos );

			if( pos != value.length() )
				throw exception_t< string_trait_t >(
					string_trait_t::from_ascii( "Invalid value: \"" ) +
					value + string_trait_t::from_ascii( "\". In file \"" ) +
					info.file_name() +
					string_trait_t::from_ascii( "\" on line " ) +
					string_trait_t::to_string( info.line_number() ) +
					string_trait_t::from_ascii( "." ) );

			return result;
		}
		catch( const std::exception & )
		{
			throw exception_t< string_trait_t >(
				string_trait_t::from_ascii( "Invalid value: \"" ) +
				value + string_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				string_trait_t::from_ascii( "\" on line " ) +
				string_trait_t::to_string( info.line_number() ) +
				string_trait_t::from_ascii( "." ) );
		}
	}